

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DICEPS.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  time_t tVar4;
  long *plVar5;
  DecPOMDPDiscreteInterface *pDVar6;
  ostream *poVar7;
  DICEPSPlanner *this;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined1 in_XMM2 [16];
  tms ts_before;
  string convergenceFilename;
  PlanningUnitMADPDiscreteParameters local_8d9;
  undefined4 local_8d8;
  undefined2 local_8d4;
  undefined1 local_8d2;
  double local_8d0;
  char formvalue [10];
  long local_8b8 [2];
  ulong local_8a8;
  double local_8a0;
  string filename;
  tms ts_after;
  string timingsFilename;
  Timing Time;
  ofstream of;
  filebuf local_7e8 [8];
  long local_7e0 [2];
  byte abStack_7d0 [216];
  ios_base aiStack_6f8 [264];
  Arguments args;
  stringstream ss;
  ostream local_3a8 [112];
  ios_base local_338 [264];
  ofstream conv_of;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DICE: direct CE Policy Search",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  local_8a8 = (ulong)args.horizon;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Horizon = ",10);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_8a8);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  Timing::Timing(&Time);
  _of = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&of,"Overall","");
  Timing::Start((string *)&Time);
  if (_of != local_7e0) {
    operator_delete(_of,local_7e0[0] + 1);
  }
  pDVar6 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"/dev/null","");
  timingsFilename._M_dataplus._M_p = (pointer)&timingsFilename.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&timingsFilename,"/dev/null","");
  convergenceFilename._M_dataplus._M_p = (pointer)&convergenceFilename.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&convergenceFilename,"/dev/null","");
  std::ofstream::ofstream(&of);
  std::ofstream::ofstream(&conv_of);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ts_after.tms_utime = (clock_t)&ts_after.tms_cutime;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ts_after,"DICEPS","");
  directories::MADPGetResultsFilename
            ((string *)&ts_before,(MultiAgentDecisionProcessInterface *)&ts_after,
             (Arguments *)(pDVar6 + *(long *)(*(long *)pDVar6 + -0x40)));
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_3a8,(char *)ts_before.tms_utime,ts_before.tms_stime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"h",1);
  std::ostream::operator<<(poVar7,(int)local_8a8);
  if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
    operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
  }
  if ((clock_t *)ts_after.tms_utime != &ts_after.tms_cutime) {
    operator_delete((void *)ts_after.tms_utime,ts_after.tms_cutime + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,"_CEr",4);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_i",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_s",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_sfu",4);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_a",2);
  poVar7 = std::ostream::_M_insert<double>(args.CE_alpha);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_ht",3);
  poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_evals",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  if (args.dryrun == 0) {
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ts_before,"DICEPS","");
    directories::MADPCreateResultsDir
              ((string *)&ts_before,
               (MultiAgentDecisionProcessInterface *)(pDVar6 + *(long *)(*(long *)pDVar6 + -0x40)));
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&filename,(string *)&ts_before);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ts_before,filename._M_dataplus._M_p,
               filename._M_dataplus._M_p + filename._M_string_length);
    std::__cxx11::string::append((char *)&ts_before);
    std::__cxx11::string::operator=((string *)&timingsFilename,(string *)&ts_before);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ts_before,filename._M_dataplus._M_p,
               filename._M_dataplus._M_p + filename._M_string_length);
    std::__cxx11::string::append((char *)&ts_before);
    std::__cxx11::string::operator=((string *)&convergenceFilename,(string *)&ts_before);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
  }
  std::ofstream::open((char *)&of,(_Ios_Openmode)filename._M_dataplus._M_p);
  if ((abStack_7d0[_of[-3]] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computing ",10);
    std::__cxx11::stringbuf::str();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)ts_before.tms_utime,ts_before.tms_stime);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"#horiz.",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"value     ",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"wctime",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"utime ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"stime ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&of,"found jpol index\t(1tick=1/",0x1a);
    sysconf(2);
    poVar7 = std::ostream::_M_insert<long>((long)&of);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s)\n",3);
    std::ostream::flush();
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ts_before,"PlanningUnit","");
    Timing::Start((string *)&Time);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&local_8d9);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_8d9,0));
    local_8d4 = 0;
    local_8d8 = 0x10000;
    local_8d2 = args.sparse != 0;
    this = (DICEPSPlanner *)operator_new(0x3b0);
    DICEPSPlanner::DICEPSPlanner
              (this,local_8a8,pDVar6,1,args.nrCEIterations,args.nrCESamples,
               args.nrCESamplesForUpdate,args.CE_use_hard_threshold,args.CE_alpha,
               args.nrCEEvaluationRuns,&local_8d9,false,&conv_of,args.verbose);
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ts_before,"PlanningUnit","");
    Timing::Stop((string *)&Time);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DICEPSPlanner initialized",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (args.nrCERestarts != 0) {
      local_8a0 = 0.0;
      lVar12 = 0;
      uVar8 = 0;
      uVar13 = 1;
      do {
        formvalue._0_8_ = local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)formvalue,"Plan","");
        Timing::Start((string *)&Time);
        if ((long *)formvalue._0_8_ != local_8b8) {
          operator_delete((void *)formvalue._0_8_,local_8b8[0] + 1);
        }
        times((tms *)&ts_before);
        (**(code **)(*(long *)this + 0x18))();
        times((tms *)&ts_after);
        formvalue._0_8_ = local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)formvalue,"Plan","");
        Timing::Stop((string *)&Time);
        if ((long *)formvalue._0_8_ != local_8b8) {
          operator_delete((void *)formvalue._0_8_,local_8b8[0] + 1);
        }
        lVar11 = ts_after.tms_utime - ts_before.tms_utime;
        local_8d0 = (double)(**(code **)(*(long *)this + 0x98))();
        if (-1 < args.verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value=",6);
          poVar7 = std::ostream::_M_insert<double>(local_8d0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (args.verbose != 0) {
            (**(code **)(*(long *)this + 0xa0))(formvalue);
            (**(code **)(*(long *)formvalue._0_8_ + 0x38))();
            boost::detail::shared_count::~shared_count((shared_count *)(formvalue + 8));
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
          }
        }
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&of,(int)local_8a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        sprintf(formvalue,"%.6f",local_8d0);
        sVar9 = strlen(formvalue);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,formvalue,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"\t",1);
        poVar7 = std::ostream::_M_insert<long>((long)&of);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        poVar7 = std::ostream::_M_insert<long>((long)&of);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        poVar7 = std::ostream::_M_insert<long>((long)&of);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"-1\n",3);
        std::ostream::flush();
        lVar12 = lVar12 + lVar11;
        local_8a0 = local_8a0 + local_8d0;
        if (args.nrCERestarts - 1 == uVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&of,"# h ",4);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&of,args.horizon);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," avg DICEPS time (s): ",0x16);
          local_8d0 = (double)lVar12;
          lVar11 = sysconf(2);
          auVar2 = vcvtusi2sd_avx512f(in_XMM2,args.nrCERestarts);
          poVar7 = std::ostream::_M_insert<double>((local_8d0 / (double)lVar11) / auVar2._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," avg value: ",0xc);
          auVar2 = vcvtusi2sd_avx512f(in_XMM2,args.nrCERestarts);
          poVar7 = std::ostream::_M_insert<double>(local_8a0 / auVar2._0_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        bVar1 = uVar13 < args.nrCERestarts;
        uVar8 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar1);
    }
    ts_before.tms_utime = (clock_t)&ts_before.tms_cutime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ts_before,"Overall","");
    Timing::Stop((string *)&Time);
    if ((clock_t *)ts_before.tms_utime != &ts_before.tms_cutime) {
      operator_delete((void *)ts_before.tms_utime,ts_before.tms_cutime + 1);
    }
    if (-1 < args.verbose) {
      Timing::PrintSummary();
      TimedAlgorithm::PrintTimersSummary();
    }
    (**(code **)(*(long *)this + 8))();
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&local_8d9);
    iVar10 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"could not open ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,filename._M_dataplus._M_p,filename._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    iVar10 = 1;
    std::ostream::flush();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_338);
  uVar3 = _memcpy;
  lVar12 = _VTT;
  _conv_of = _VTT;
  *(undefined8 *)(&conv_of + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  _of = (long *)lVar12;
  *(undefined8 *)(&of + *(long *)(lVar12 + -0x18)) = uVar3;
  std::filebuf::~filebuf(local_7e8);
  std::ios_base::~ios_base(aiStack_6f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)convergenceFilename._M_dataplus._M_p != &convergenceFilename.field_2) {
    operator_delete(convergenceFilename._M_dataplus._M_p,
                    convergenceFilename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)timingsFilename._M_dataplus._M_p != &timingsFilename.field_2) {
    operator_delete(timingsFilename._M_dataplus._M_p,
                    timingsFilename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  Timing::~Timing(&Time);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)args.maxplus_updateT._M_dataplus._M_p != &args.maxplus_updateT.field_2) {
    operator_delete(args.maxplus_updateT._M_dataplus._M_p,
                    args.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
    cout << "DICE: direct CE Policy Search"<<endl;
    cout << "-----------------------------"<<endl;
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    srand(time(0));


    int horizon = args.horizon;
    cout << "Horizon = " << horizon << endl;


    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);

    // setup the output file stream 
    string filename="/dev/null",timingsFilename="/dev/null", 
           convergenceFilename="/dev/null";
    ofstream of, conv_of;
    stringstream ss;
    ss << directories::MADPGetResultsFilename("DICEPS",decpomdp,args)
        << "h" << horizon;
    // add the CE parameters into the output file name
    ss  << "_CEr" << args.nrCERestarts 
        << "_i" << args.nrCEIterations
        << "_s" << args.nrCESamples 
        << "_sfu" << args.nrCESamplesForUpdate
        << "_a" << args.CE_alpha 
        << "_ht" << args.CE_use_hard_threshold
        << "_evals" << args.nrCEEvaluationRuns;
    if(!args.dryrun)
    {
        directories::MADPCreateResultsDir("DICEPS",decpomdp);
        filename=ss.str();
        timingsFilename=filename + "_Timings";
        convergenceFilename=filename + "_convergence";
    }
    of.open(filename.c_str());
    if(!of)
    {
        cerr << "could not open " << filename << endl;
        return(1);
    }
    cout << "Computing " << ss.str() << endl;
    //write headers
    of << "#horiz."<<"\t";
    of << "value     " <<"\t";
    of << "wctime"<< "\t";
    of << "utime " <<"\t";
    of << "stime " <<"\t";
    of << "found jpol index\t(1tick=1/"<<sysconf(_SC_CLK_TCK)<<"s)\n";
    of.flush();
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns //the number of evaluation runs
        , &params
        , 
#if CONVERGENCE_STATS        
        true // convergence stats  
#else
        false        
#endif
        , &conv_of
        , args.verbose
    );
    Time.Stop("PlanningUnit");
    cout << "DICEPSPlanner initialized" << endl;

    clock_t total_utime_diceps=0;
    double total_value=0;
    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        //start all timers:
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        Time.Start("Plan");
        ticks_before = times(&ts_before);
        planner->Plan();
        //stop all timers
        ticks_after = times(&ts_after);
        Time.Stop("Plan");
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;
        clock_t stime =   ts_after.tms_stime - ts_before.tms_stime;

        total_utime_diceps+=utime;

        double V = planner->GetExpectedReward();
        if(args.verbose >= 0)
        {
            cout << "value="<< V << endl;
            if(args.verbose)        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
            }
        }
        total_value+=V;
        
        of << horizon<<"\t";
        char formvalue[10];
        sprintf(formvalue, "%.6f", V);
        of << formvalue <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << stime <<"\t";
        of << "-1\n";//Cannot get index of joint pol., since  "planner->GetJointPolicyPureVector()->GetIndex()" does not work
        of.flush();

        // output average statistics after completing the last restart
        if(restartI==(args.nrCERestarts-1))
            of << "# h " << args.horizon<<"\t"
               << " avg DICEPS time (s): "
               << (static_cast<double>(total_utime_diceps)/
                   sysconf(_SC_CLK_TCK))/args.nrCERestarts
               << " avg value: " << total_value/args.nrCERestarts
               << endl;
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }
#if 0
    if(//args.saveTimings && 
            !args.dryrun)
    {
        Time.Save(timingsFilename);
        planner->SaveTimers(timingsFilename);
    }
#endif
    delete planner;
    }
    catch(E& e){ e.Print(); }
}